

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void showMemInfo(void)

{
  Process *pPVar1;
  MemBlock *pMVar2;
  bool bVar3;
  _Setiosflags _Var4;
  _Setw _Var5;
  ostream *poVar6;
  reference ppPVar7;
  size_type sVar8;
  reference ppMVar9;
  MemBlock *i_3;
  iterator __end1_3;
  iterator __begin1_3;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *__range1_3;
  MemBlock *used;
  Process *i_2;
  iterator __end1_2;
  iterator __begin1_2;
  list<Process_*,_std::allocator<Process_*>_> *__range1_2;
  MemBlock *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *__range1_1;
  MemBlock *i;
  iterator __end1;
  iterator __begin1;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *__range1;
  int allUsedSize;
  int allFreeSize;
  
  printSplitLine();
  __range1._4_4_ = 0;
  __range1._0_4_ = 0;
  __end1 = std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::begin
                     (&freeMemBlockList_abi_cxx11_);
  i = (MemBlock *)
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::end(&freeMemBlockList_abi_cxx11_)
  ;
  while( true ) {
    bVar3 = std::operator!=(&__end1,(_Self *)&i);
    if (!bVar3) break;
    ppMVar9 = std::_List_iterator<MemBlock_*>::operator*(&__end1);
    __range1._4_4_ = (*ppMVar9)->length + __range1._4_4_;
    std::_List_iterator<MemBlock_*>::operator++(&__end1);
  }
  __end1_1 = std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::begin
                       (&usedMemBlockList_abi_cxx11_);
  i_1 = (MemBlock *)
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::end
                  (&usedMemBlockList_abi_cxx11_);
  while( true ) {
    bVar3 = std::operator!=(&__end1_1,(_Self *)&i_1);
    if (!bVar3) break;
    ppMVar9 = std::_List_iterator<MemBlock_*>::operator*(&__end1_1);
    __range1._0_4_ = (*ppMVar9)->length + (int)__range1;
    std::_List_iterator<MemBlock_*>::operator++(&__end1_1);
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"main mem info:");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"\ttotal: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,memSize);
  poVar6 = std::operator<<(poVar6,"\t\tused: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)__range1);
  poVar6 = std::operator<<(poVar6,"\t\tfree: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,__range1._4_4_);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"used mem info:");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"\tfrom\tto  \tsize\townerProcess");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  __end1_2 = std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::begin
                       (&processList_abi_cxx11_);
  i_2 = (Process *)
        std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::end(&processList_abi_cxx11_);
  while( true ) {
    bVar3 = std::operator!=(&__end1_2,(_Self *)&i_2);
    if (!bVar3) break;
    ppPVar7 = std::_List_iterator<Process_*>::operator*(&__end1_2);
    pPVar1 = *ppPVar7;
    pMVar2 = pPVar1->memBlock;
    poVar6 = std::operator<<((ostream *)&std::cout,"\t");
    _Var4 = std::setiosflags(_S_left);
    poVar6 = std::operator<<(poVar6,_Var4);
    _Var5 = std::setw(7);
    poVar6 = std::operator<<(poVar6,_Var5);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pMVar2->start);
    poVar6 = std::operator<<(poVar6," ");
    _Var4 = std::setiosflags(_S_left);
    poVar6 = std::operator<<(poVar6,_Var4);
    _Var5 = std::setw(7);
    poVar6 = std::operator<<(poVar6,_Var5);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pMVar2->start + pMVar2->length + -1);
    poVar6 = std::operator<<(poVar6," ");
    _Var4 = std::setiosflags(_S_left);
    poVar6 = std::operator<<(poVar6,_Var4);
    _Var5 = std::setw(7);
    poVar6 = std::operator<<(poVar6,_Var5);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pMVar2->length);
    poVar6 = std::operator<<(poVar6," ");
    _Var4 = std::setiosflags(_S_left);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,pPVar1->name);
    poVar6 = std::operator<<(poVar6,"(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar1->pid);
    poVar6 = std::operator<<(poVar6,")");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::_List_iterator<Process_*>::operator++(&__end1_2);
  }
  sVar8 = std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::size(&processList_abi_cxx11_);
  if (sVar8 == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\t");
    poVar6 = std::operator<<(poVar6,"none");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"free mem info:");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"\tfrom\tto  \tsize");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  __end1_3 = std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::begin
                       (&freeMemBlockList_abi_cxx11_);
  i_3 = (MemBlock *)
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::end
                  (&freeMemBlockList_abi_cxx11_);
  while( true ) {
    bVar3 = std::operator!=(&__end1_3,(_Self *)&i_3);
    if (!bVar3) break;
    ppMVar9 = std::_List_iterator<MemBlock_*>::operator*(&__end1_3);
    pMVar2 = *ppMVar9;
    poVar6 = std::operator<<((ostream *)&std::cout,"\t");
    _Var4 = std::setiosflags(_S_left);
    poVar6 = std::operator<<(poVar6,_Var4);
    _Var5 = std::setw(7);
    poVar6 = std::operator<<(poVar6,_Var5);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pMVar2->start);
    poVar6 = std::operator<<(poVar6," ");
    _Var4 = std::setiosflags(_S_left);
    poVar6 = std::operator<<(poVar6,_Var4);
    _Var5 = std::setw(7);
    poVar6 = std::operator<<(poVar6,_Var5);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pMVar2->start + pMVar2->length + -1);
    poVar6 = std::operator<<(poVar6," ");
    _Var4 = std::setiosflags(_S_left);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pMVar2->length);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::_List_iterator<MemBlock_*>::operator++(&__end1_3);
  }
  sVar8 = std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::size
                    (&freeMemBlockList_abi_cxx11_);
  if (sVar8 == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\t");
    poVar6 = std::operator<<(poVar6,"none");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  printSplitLine();
  return;
}

Assistant:

void showMemInfo() {
    printSplitLine();
    // 先输出概况
    int allFreeSize = 0, allUsedSize = 0;
    for (MemBlock *i : freeMemBlockList) allFreeSize += i->length;
    for (MemBlock *i : usedMemBlockList) allUsedSize += i->length;
    cout << "main mem info:" << endl;
    cout << "\ttotal: " << memSize
         << "\t\tused: " << allUsedSize
         << "\t\tfree: " << allFreeSize
         << endl;
    cout << endl;
    cout << "used mem info:" << endl;
    cout << "\tfrom\tto  \tsize\townerProcess" << endl;
    // 输出已经被使用的内存块情况
    for (Process *i : processList) {
        MemBlock *used = i->memBlock;
        cout << "\t" << setiosflags(ios::left) << setw(7) << used->start
             << " " << setiosflags(ios::left) << setw(7) << used->start + used->length - 1
             << " " << setiosflags(ios::left) << setw(7) << used->length
             << " " << setiosflags(ios::left) << i->name << "(" << i->pid << ")"
             << endl;
    }
    if (processList.size() == 0) cout << "\t" << "none" << endl;
    cout << endl;
    // 输出空闲内存块情况
    cout << "free mem info:" << endl;
    cout << "\tfrom\tto  \tsize" << endl;
    for (MemBlock *i : freeMemBlockList)
        cout << "\t" << setiosflags(ios::left) << setw(7) << i->start
             << " " << setiosflags(ios::left) << setw(7) << i->start + i->length - 1
             << " " << setiosflags(ios::left) << i->length
             << endl;
    if (freeMemBlockList.size() == 0) cout << "\t" << "none" << endl;
    printSplitLine();
}